

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::ReadWaveformStatus(AmpIO *this,bool *active,uint32_t *tableIndex)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  ostream *this_00;
  uint local_2c;
  bool ret;
  uint32_t *puStack_28;
  uint32_t read_data;
  uint32_t *tableIndex_local;
  bool *active_local;
  AmpIO *this_local;
  
  puStack_28 = tableIndex;
  tableIndex_local = (uint32_t *)active;
  active_local = (bool *)this;
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 7) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x64524131) {
      this_00 = std::operator<<((ostream *)&std::cerr,"ReadWaveformStatus not implemented for dRAC")
      ;
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      local_2c = 0;
      if ((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        uVar3 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,6,&local_2c);
        this_local._7_1_ = (bool)((byte)uVar3 & 1);
        if ((uVar3 & 1) != 0) {
          *(bool *)tableIndex_local = (local_2c & 0x80000000) != 0;
          *puStack_28 = local_2c >> 0x10 & 0x3ff;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::ReadWaveformStatus(bool &active, uint32_t &tableIndex)
{
    if (GetFirmwareVersion() < 7) return false;

    if (GetHardwareVersion() == dRA1_String) {
        std::cerr << "ReadWaveformStatus not implemented for dRAC" << std::endl;
        return false;
    }

    uint32_t read_data = 0;
    if (!port) return false;
    bool ret = port->ReadQuadlet(BoardId, 6, read_data);
    if (ret) {
        active = read_data&VALID_BIT;
        tableIndex = (read_data>>16)&0x000003ff;
    }
    return ret;
}